

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O3

int __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::init
          (ZlibDecompressor *this,EVP_PKEY_CTX *ctx)

{
  runtime_error *this_00;
  int in_EDX;
  code *pcVar1;
  int iVar2;
  undefined *puVar3;
  
  iVar2 = (int)ctx;
  if (in_EDX == 2) {
    iVar2 = iVar2 + 0x10;
  }
  else if (in_EDX == 0) {
    iVar2 = -iVar2;
  }
  inflateEnd(&this->zs);
  (this->zs).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_in = 0;
  (this->zs).total_in = 0;
  (this->zs).next_out = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_out = 0;
  (this->zs).total_out = 0;
  (this->zs).msg = (char *)0x0;
  (this->zs).state = (internal_state *)0x0;
  (this->zs).zalloc = (alloc_func)0x0;
  (this->zs).zfree = (free_func)0x0;
  (this->zs).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->zs).data_type = 0;
  (this->zs).adler = 0;
  (this->zs).reserved = 0;
  iVar2 = inflateInit2_(&this->zs,iVar2,"1.2.11",0x70);
  if (iVar2 == -2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error((domain_error *)this_00,"zlib decompressor: bad arg");
    puVar3 = &std::domain_error::typeinfo;
    pcVar1 = std::domain_error::~domain_error;
  }
  else {
    if (iVar2 != -4) {
      return iVar2;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"zlib decompressor: no memory");
    puVar3 = &std::runtime_error::typeinfo;
    pcVar1 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar3,pcVar1);
}

Assistant:

void init(int windowBits, wrap wrap) override
        {
            if(wrap == boost::deflate::wrap::none)
                windowBits *= -1;
            else if(wrap == boost::deflate::wrap::gzip)
                windowBits += 16;
            inflateEnd(&zs);
            zs = {};
            const auto res = inflateInit2(&zs, windowBits);
            switch(res){
            case Z_OK:
               break;
            case Z_MEM_ERROR:
               throw std::runtime_error{"zlib decompressor: no memory"};
            case Z_STREAM_ERROR:
               throw std::domain_error{"zlib decompressor: bad arg"};
            }
        }